

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop-fixture.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  green_loop_t loop_00;
  undefined8 in_R9;
  FILE *__stream;
  undefined8 uVar3;
  green_loop_t loop;
  char **argv_local;
  int argc_local;
  
  fprintf(_stderr,"green include version: \"%s\".\n","0.1.0");
  __stream = _stderr;
  pcVar2 = green_version_string();
  fprintf(__stream,"green library version: \"%s\".\n",pcVar2);
  iVar1 = _green_init(0,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/loop-fixture.c"
            ,0xd,"(_green_init(0, 1)) == (0)");
    abort();
  }
  loop_00 = green_loop_init();
  if (loop_00 == (green_loop_t)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/loop-fixture.c"
            ,0xf,"(loop) != (((void*)0))");
    abort();
  }
  iVar1 = test(loop_00);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/loop-fixture.c"
            ,0x10,"(test(loop)) == (0)");
    abort();
  }
  iVar1 = green_loop_release(loop_00);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/loop-fixture.c"
            ,0x11,"(green_loop_release(loop)) == (0)");
    abort();
  }
  uVar3 = 0;
  iVar1 = green_term();
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/loop-fixture.c"
            ,0x12,"(green_term()) == (0)",in_R9,__stream,uVar3);
    abort();
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    fprintf(stderr, "green include version: \"%s\".\n", GREEN_VERSION_STRING);
    fprintf(stderr,
            "green library version: \"%s\".\n", green_version_string());

    check_eq(green_init(), 0);
    green_loop_t loop = green_loop_init();
    check_ne(loop, NULL);
    check_eq(test(loop), 0);
    check_eq(green_loop_release(loop), 0); loop = NULL;
    check_eq(green_term(), 0);

    return EXIT_SUCCESS;
}